

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wf.h
# Opt level: O1

bool __thiscall trieste::wf::Sequence::check(Sequence *this,Node *node)

{
  element_type *peVar1;
  pointer psVar2;
  Node *t;
  bool bVar3;
  bool bVar4;
  pointer psVar5;
  bool bVar6;
  Node local_228;
  Node *local_218;
  unsigned_long local_210;
  string local_208;
  string local_1e8;
  Log local_1c8;
  
  peVar1 = (node->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  psVar5 = (peVar1->children).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->children).
           super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar4 = true;
  local_218 = node;
  if (psVar5 == psVar2) {
    bVar6 = false;
  }
  else {
    bVar4 = true;
    bVar3 = false;
    do {
      bVar6 = true;
      if (!bVar3) {
        bVar6 = (((psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                ->type_).def == (TokenDef *)Error;
      }
      local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (psVar5->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
      if (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      bVar3 = Choice::check(&this->choice,&local_228);
      if (!bVar3) {
        bVar4 = false;
      }
      if (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_228.super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      psVar5 = psVar5 + 1;
      bVar3 = bVar6;
    } while (psVar5 != psVar2);
  }
  t = local_218;
  if ((!bVar6) &&
     (peVar1 = (local_218->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
     (ulong)((long)(peVar1->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(peVar1->children).
                   super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4) < this->minlen)) {
    local_1c8.print = Silent;
    if (1 < logging::detail::report_level) {
      logging::Log::start(&local_1c8,Error);
    }
    Location::origin_linecol_abi_cxx11_
              (&local_1e8,
               &((t->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                location_);
    if (local_1c8.print != Silent) {
      logging::append<std::__cxx11::string>(&local_1c8,&local_1e8);
    }
    if (local_1c8.print != Silent) {
      logging::append<char[21]>(&local_1c8,(char (*) [21])": expected at least ");
    }
    if (local_1c8.print != Silent) {
      logging::append<unsigned_long>(&local_1c8,&this->minlen);
    }
    if (local_1c8.print != Silent) {
      logging::append<char[18]>(&local_1c8,(char (*) [18])0x242822);
    }
    peVar1 = (t->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_210 = (long)(peVar1->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar1->children).
                      super__Vector_base<std::shared_ptr<trieste::NodeDef>,_std::allocator<std::shared_ptr<trieste::NodeDef>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
    if (local_1c8.print != Silent) {
      logging::append<unsigned_long>(&local_1c8,&local_210);
    }
    if (local_1c8.print != Silent) {
      logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
    }
    Location::str_abi_cxx11_
              (&local_208,
               &((t->super___shared_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                location_);
    if (local_1c8.print != Silent) {
      logging::append<std::__cxx11::string>(&local_1c8,&local_208);
    }
    if (local_1c8.print != Silent) {
      logging::append<std::shared_ptr<trieste::NodeDef>>(&local_1c8,t);
    }
    if (local_1c8.print != Silent) {
      logging::Log::operation(&local_1c8,std::endl<char,std::char_traits<char>>);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    if (local_1c8.print != Silent) {
      logging::Log::end(&local_1c8);
    }
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool check(Node node) const
      {
        auto has_err = false;
        auto ok = true;

        for (auto& child : *node)
        {
          has_err = has_err || (child == Error);
          ok = choice.check(child) && ok;
        }

        if (!has_err && (node->size() < minlen))
        {
          logging::Error() << node->location().origin_linecol()
                           << ": expected at least " << minlen
                           << " children, found " << node->size() << std::endl
                           << node->location().str() << node << std::endl;
          ok = false;
        }

        return ok;
      }